

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_2::detail::
lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
::lexer(lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
        *this,iterator_input_adapter<const_char_*> *adapter,bool ignore_comments_)

{
  char cVar1;
  int_type iVar2;
  bool ignore_comments__local;
  iterator_input_adapter<const_char_*> *adapter_local;
  lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
  *this_local;
  
  (this->ia).current = adapter->current;
  (this->ia).end = adapter->end;
  this->ignore_comments = ignore_comments_;
  iVar2 = std::char_traits<char>::eof();
  this->current = iVar2;
  this->next_unget = false;
  (this->position).chars_read_total = 0;
  (this->position).chars_read_current_line = 0;
  (this->position).lines_read = 0;
  memset(&this->token_string,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector(&this->token_string);
  std::__cxx11::string::string((string *)&this->token_buffer);
  this->error_message = "";
  this->value_integer = 0;
  this->value_unsigned = 0;
  this->value_float = 0.0;
  cVar1 = get_decimal_point();
  this->decimal_point_char = (int)cVar1;
  return;
}

Assistant:

explicit lexer(InputAdapterType&& adapter, bool ignore_comments_ = false) noexcept
        : ia(std::move(adapter))
        , ignore_comments(ignore_comments_)
        , decimal_point_char(static_cast<char_int_type>(get_decimal_point()))
    {}